

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_wrappers.hpp
# Opt level: O2

void __thiscall pcplusplus::threads::generic_threads::~generic_threads(generic_threads *this)

{
  ~generic_threads(this);
  operator_delete(this,0x268);
  return;
}

Assistant:

virtual ~generic_threads(){
		if(logfile.is_open())
		    logfile.close();
		threads.reset(nullptr);
	    }